

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markable.hpp
# Opt level: O3

void __thiscall
ak_toolkit::markable_ns::dual_storage<mark_range2>::operator=
          (dual_storage<mark_range2> *this,dual_storage<mark_range2> *rhs)

{
  int iVar1;
  int iVar2;
  union_type uVar3;
  
  iVar1 = (rhs->value_)._value.super_range2_members.min_;
  iVar2 = (rhs->value_)._value.super_range2_members.max_;
  if ((this->value_)._value.super_range2_members.max_ <
      (this->value_)._value.super_range2_members.min_) {
    if (iVar1 <= iVar2) {
      range2::range2((range2 *)this,(range2 *)rhs);
      return;
    }
  }
  else {
    if (iVar2 < iVar1) {
      if ((rhs->value_)._value.super_range2_members.min_ <= iVar2) {
        return;
      }
      range2::~range2((range2 *)this);
      uVar3 = (union_type)0xffffffff00000000;
    }
    else {
      uVar3._value.super_range2_members = *(value_type *)&rhs->value_;
    }
    this->value_ = uVar3;
  }
  return;
}

Assistant:

void operator=(dual_storage&& rhs) // TODO: add noexcept
    {
      if (has_value() && rhs.has_value())
      {
        as_value() = std::move(rhs.as_value());
      }
      else if (has_value() && !rhs.has_value())
      {
        clear_value();
      }
      else if (!has_value() && rhs.has_value())
      {
        change_to_value(std::move(rhs.as_value()));
      }
    }